

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dxil_sampling.cpp
# Opt level: O3

bool dxil_spv::get_texel_offsets
               (Impl *impl,CallInst *instruction,uint32_t *image_flags,uint base_operand,
               uint num_coords,Id *offsets,bool instruction_is_gather)

{
  ValueKind VVar1;
  Id IVar2;
  Builder *this;
  Value *pVVar3;
  Constant *pCVar4;
  APInt *pAVar5;
  int64_t iVar6;
  Builder *pBVar7;
  Operation *op;
  uint uVar8;
  ulong uVar9;
  bool bVar10;
  bool bVar11;
  Capability local_34;
  
  this = Converter::Impl::builder(impl);
  pBVar7 = this;
  if (num_coords != 0) {
    bVar10 = false;
    bVar11 = true;
    uVar8 = 0;
    do {
      pVVar3 = LLVMBC::Instruction::getOperand(&instruction->super_Instruction,base_operand + uVar8)
      ;
      pVVar3 = LLVMBC::Internal::resolve_proxy(pVVar3);
      VVar1 = LLVMBC::Value::get_value_kind(pVVar3);
      pBVar7 = (Builder *)(ulong)VVar1;
      if (VVar1 != Undef) {
        pVVar3 = LLVMBC::Instruction::getOperand
                           (&instruction->super_Instruction,base_operand + uVar8);
        if (pVVar3 != (Value *)0x0) {
          pCVar4 = (Constant *)LLVMBC::Internal::resolve_proxy(pVVar3);
          VVar1 = LLVMBC::Value::get_value_kind((Value *)pCVar4);
          if (VVar1 == ConstantInt) {
            pAVar5 = LLVMBC::Constant::getUniqueInteger(pCVar4);
            iVar6 = LLVMBC::APInt::getSExtValue(pAVar5);
            pBVar7 = (Builder *)(ulong)(iVar6 != 0);
            bVar10 = (bool)(bVar10 | iVar6 != 0);
            goto LAB_0016cb80;
          }
        }
        local_34 = CapabilityImageGatherExtended;
        std::
        _Rb_tree<spv::Capability,spv::Capability,std::_Identity<spv::Capability>,std::less<spv::Capability>,dxil_spv::ThreadLocalAllocator<spv::Capability>>
        ::_M_insert_unique<spv::Capability_const&>
                  ((_Rb_tree<spv::Capability,spv::Capability,std::_Identity<spv::Capability>,std::less<spv::Capability>,dxil_spv::ThreadLocalAllocator<spv::Capability>>
                    *)&this->capabilities,&local_34);
        uVar8 = 0x10;
        goto LAB_0016cbc7;
      }
LAB_0016cb80:
      uVar8 = uVar8 + 1;
      bVar11 = uVar8 < num_coords;
    } while (uVar8 != num_coords);
    if (bVar10) {
      uVar8 = 8;
      bVar11 = false;
LAB_0016cbc7:
      *image_flags = *image_flags | uVar8;
      uVar9 = 0;
      do {
        uVar8 = base_operand + (int)uVar9;
        pVVar3 = LLVMBC::Instruction::getOperand(&instruction->super_Instruction,uVar8);
        pVVar3 = LLVMBC::Internal::resolve_proxy(pVVar3);
        VVar1 = LLVMBC::Value::get_value_kind(pVVar3);
        if (VVar1 == Undef) {
          IVar2 = spv::Builder::makeIntegerType(this,0x20,true);
          uVar8 = spv::Builder::makeIntConstant(this,IVar2,0,false);
        }
        else {
          pVVar3 = LLVMBC::Instruction::getOperand(&instruction->super_Instruction,uVar8);
          if (bVar11) {
            IVar2 = spv::Builder::makeIntegerType(this,0x20,true);
            op = Converter::Impl::allocate(impl,OpBitcast,IVar2);
            Converter::Impl::add(impl,op,false);
            IVar2 = Converter::Impl::get_id_for_value(impl,pVVar3,0);
            Operation::add_id(op,IVar2);
            uVar8 = op->id;
          }
          else {
            pCVar4 = (Constant *)LLVMBC::Internal::resolve_proxy(pVVar3);
            VVar1 = LLVMBC::Value::get_value_kind((Value *)pCVar4);
            if (VVar1 != ConstantInt) {
              pCVar4 = (Constant *)0x0;
            }
            pAVar5 = LLVMBC::Constant::getUniqueInteger(pCVar4);
            iVar6 = LLVMBC::APInt::getSExtValue(pAVar5);
            IVar2 = spv::Builder::makeIntegerType(this,0x20,true);
            uVar8 = spv::Builder::makeIntConstant(this,IVar2,(uint)iVar6,false);
          }
        }
        pBVar7 = (Builder *)(ulong)uVar8;
        offsets[uVar9] = uVar8;
        uVar9 = uVar9 + 1;
      } while (num_coords != uVar9);
    }
  }
  return SUB81(pBVar7,0);
}

Assistant:

static bool get_texel_offsets(Converter::Impl &impl, const llvm::CallInst *instruction, uint32_t &image_flags,
                              unsigned base_operand, unsigned num_coords, spv::Id *offsets,
                              bool instruction_is_gather)
{
	auto &builder = impl.builder();

	bool is_const_offset = true;
	bool has_non_zero_offset = false;

	for (unsigned i = 0; i < num_coords; i++)
	{
		// Treat undefined offset as 0, since we can.
		if (!llvm::isa<llvm::UndefValue>(instruction->getOperand(base_operand + i)))
		{
			auto *constant_arg = llvm::dyn_cast<llvm::ConstantInt>(instruction->getOperand(base_operand + i));
			if (constant_arg)
			{
				if (constant_arg->getUniqueInteger().getSExtValue() != 0)
					has_non_zero_offset = true;
			}
			else
			{
				builder.addCapability(spv::CapabilityImageGatherExtended);
				is_const_offset = false;
				has_non_zero_offset = true;
				break;
			}
		}
	}

	// Don't bother emitting offset if they are all 0.
	if (!has_non_zero_offset)
		return true;

	if (is_const_offset)
		image_flags |= spv::ImageOperandsConstOffsetMask;
	else
		image_flags |= spv::ImageOperandsOffsetMask;

	for (unsigned i = 0; i < num_coords; i++)
	{
		if (!llvm::isa<llvm::UndefValue>(instruction->getOperand(base_operand + i)))
		{
			auto operand = instruction->getOperand(base_operand + i);
			if (is_const_offset)
			{
				auto *constant_arg = llvm::dyn_cast<llvm::ConstantInt>(operand);
				offsets[i] = builder.makeIntConstant(int(constant_arg->getUniqueInteger().getSExtValue()));
			}
			else
			{
				// Makes sure when we build the array, it's the correct element type.
				auto *cast_op = impl.allocate(spv::OpBitcast, builder.makeIntegerType(32, true));
				impl.add(cast_op);
				cast_op->add_id(impl.get_id_for_value(operand));
				offsets[i] = cast_op->id;
			}
		}
		else
			offsets[i] = builder.makeIntConstant(0);
	}

	return true;
}